

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_diff.cpp
# Opt level: O0

void __thiscall Diff_UncomittedTransaction_Test::TestBody(Diff_UncomittedTransaction_Test *this)

{
  bool bVar1;
  char *pcVar2;
  element_type *peVar3;
  back_insert_iterator<std::vector<pstore::address,_std::allocator<pstore::address>_>_> bVar4;
  database *pdVar5;
  iterator iVar6;
  UnorderedElementsAreMatcher<std::tuple<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::extent<char>_>,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::extent<char>_>_>_>
  *matcher;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::extent<char>_>
  *matchers;
  UnorderedElementsAreMatcher<std::tuple<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::extent<char>_>_>_>
  *matcher_00;
  __normal_iterator<pstore::address_*,_std::vector<pstore::address,_std::allocator<pstore::address>_>_>
  in_R9;
  AssertHelper local_508;
  Message local_500;
  uint local_4f4;
  size_type local_4f0;
  undefined1 local_4e8 [8];
  AssertionResult gtest_ar_5;
  shared_ptr<pstore::index::hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::extent<char>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_4c8;
  undefined1 local_4b8 [8];
  vector<pstore::address,_std::allocator<pstore::address>_> actual_2;
  Message local_498;
  uint local_490;
  uint local_48c;
  undefined1 local_488 [8];
  AssertionResult gtest_ar_4;
  Message local_470;
  UnorderedElementsAreMatcher<std::tuple<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::extent<char>_>_>_>
  local_468;
  PredicateFormatterFromMatcher<testing::internal::UnorderedElementsAreMatcher<std::tuple<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::extent<char>_>_>_>_>
  local_438;
  undefined1 local_408 [8];
  AssertionResult gtest_ar_3;
  undefined1 local_3e8 [8];
  vector<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::extent<char>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::extent<char>_>_>_>
  actual_values_1;
  undefined1 local_3c0 [8];
  vector<pstore::address,_std::allocator<pstore::address>_> actual_1;
  Message local_3a0;
  void *local_398;
  undefined1 local_390 [8];
  AssertionResult gtest_ar_2;
  shared_ptr<pstore::index::hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::extent<char>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  index_1;
  Message local_368;
  UnorderedElementsAreMatcher<std::tuple<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::extent<char>_>,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::extent<char>_>_>_>
  local_360;
  PredicateFormatterFromMatcher<testing::internal::UnorderedElementsAreMatcher<std::tuple<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::extent<char>_>,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::extent<char>_>_>_>_>
  local_300;
  undefined1 local_2a0 [8];
  AssertionResult gtest_ar_1;
  undefined1 local_280 [8];
  vector<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::extent<char>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::extent<char>_>_>_>
  actual_values;
  undefined1 local_258 [8];
  vector<pstore::address,_std::allocator<pstore::address>_> actual;
  AssertHelper local_238;
  Message local_230;
  void *local_228;
  undefined1 local_220 [8];
  AssertionResult gtest_ar;
  shared_ptr<pstore::index::hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::extent<char>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  index;
  string local_1f8;
  extent<char> local_1d8;
  undefined1 local_1c8 [8];
  value_type v2;
  undefined1 local_188 [8];
  transaction_type t2;
  undefined1 local_148 [8];
  string k2;
  string local_120;
  extent<char> local_100;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::extent<char>_>
  local_f0;
  unique_lock<mock_mutex> local_c0;
  undefined1 local_b0 [8];
  transaction_type t1;
  allocator local_61;
  undefined1 local_60 [8];
  string k1;
  value_type v1;
  Diff_UncomittedTransaction_Test *this_local;
  
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::extent<char>_>
  ::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::extent<char>,_true>
            ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::extent<char>_>
              *)((long)&k1.field_2 + 8));
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)local_60,"key1",&local_61);
  std::allocator<char>::~allocator((allocator<char> *)&local_61);
  std::unique_lock<mock_mutex>::unique_lock(&local_c0,(mutex_type *)&(this->super_Diff).field_0x150)
  ;
  ::begin((transaction<std::unique_lock<mock_mutex>_> *)local_b0,&(this->super_Diff).db_,&local_c0);
  std::unique_lock<mock_mutex>::~unique_lock(&local_c0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_120,"first value",(allocator *)(k2.field_2._M_local_buf + 0xf));
  local_100 = anon_unknown.dwarf_bc6fc::Diff::add
                        (&this->super_Diff,(transaction_type *)local_b0,(string *)local_60,
                         &local_120);
  std::make_pair<std::__cxx11::string_const&,pstore::extent<char>>
            (&local_f0,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_60
             ,&local_100);
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::extent<char>_>
  ::operator=((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::extent<char>_>
               *)((long)&k1.field_2 + 8),&local_f0);
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::extent<char>_>
  ::~pair(&local_f0);
  std::__cxx11::string::~string((string *)&local_120);
  std::allocator<char>::~allocator((allocator<char> *)(k2.field_2._M_local_buf + 0xf));
  pstore::transaction_base::commit((transaction_base *)local_b0);
  pstore::transaction<std::unique_lock<mock_mutex>_>::~transaction
            ((transaction<std::unique_lock<mock_mutex>_> *)local_b0);
  std::__cxx11::string::~string((string *)local_60);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)local_148,"key2",(allocator *)&t2.lock_.field_0xf);
  std::allocator<char>::~allocator((allocator<char> *)&t2.lock_.field_0xf);
  std::unique_lock<mock_mutex>::unique_lock
            ((unique_lock<mock_mutex> *)&v2.second.size,
             (mutex_type *)&(this->super_Diff).field_0x150);
  ::begin((transaction<std::unique_lock<mock_mutex>_> *)local_188,&(this->super_Diff).db_,
          (unique_lock<mock_mutex> *)&v2.second.size);
  std::unique_lock<mock_mutex>::~unique_lock((unique_lock<mock_mutex> *)&v2.second.size);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_1f8,"second value",
             (allocator *)
             ((long)&index.
                     super___shared_ptr<pstore::index::hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::extent<char>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_(__gnu_cxx::_Lock_policy)2>
                     ._M_refcount._M_pi + 7));
  local_1d8 = anon_unknown.dwarf_bc6fc::Diff::add
                        (&this->super_Diff,(transaction_type *)local_188,(string *)local_148,
                         &local_1f8);
  std::make_pair<std::__cxx11::string_const&,pstore::extent<char>>
            ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::extent<char>_>
              *)local_1c8,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_148,
             &local_1d8);
  std::__cxx11::string::~string((string *)&local_1f8);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&index.
                     super___shared_ptr<pstore::index::hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::extent<char>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_(__gnu_cxx::_Lock_policy)2>
                     ._M_refcount._M_pi + 7));
  pstore::index::
  get_index<(pstore::trailer::indices)5,pstore::database,pstore::index::hamt_map<std::__cxx11::string,pstore::extent<char>,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>>>
            ((index *)&gtest_ar.message_,&(this->super_Diff).db_,true);
  local_228 = (void *)0x0;
  testing::internal::
  CmpHelperNE<std::shared_ptr<pstore::index::hamt_map<std::__cxx11::string,pstore::extent<char>,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>>>,decltype(nullptr)>
            ((internal *)local_220,"index","nullptr",
             (shared_ptr<pstore::index::hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::extent<char>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)&gtest_ar.message_,&local_228);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_220);
  if (!bVar1) {
    testing::Message::Message(&local_230);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_220);
    testing::internal::AssertHelper::AssertHelper
              (&local_238,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/core/test_diff.cpp"
               ,0xa5,pcVar2);
    testing::internal::AssertHelper::operator=(&local_238,&local_230);
    testing::internal::AssertHelper::~AssertHelper(&local_238);
    testing::Message::~Message(&local_230);
  }
  actual.super__Vector_base<pstore::address,_std::allocator<pstore::address>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._5_3_ = 0;
  actual.super__Vector_base<pstore::address,_std::allocator<pstore::address>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._4_1_ = !bVar1;
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_220);
  if (actual.super__Vector_base<pstore::address,_std::allocator<pstore::address>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage._4_4_ == 0) {
    std::vector<pstore::address,_std::allocator<pstore::address>_>::vector
              ((vector<pstore::address,_std::allocator<pstore::address>_> *)local_258);
    peVar3 = std::
             __shared_ptr_access<pstore::index::hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::extent<char>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator*((__shared_ptr_access<pstore::index::hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::extent<char>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)&gtest_ar.message_);
    bVar4 = std::back_inserter<std::vector<pstore::address,std::allocator<pstore::address>>>
                      ((vector<pstore::address,_std::allocator<pstore::address>_> *)local_258);
    actual_values.
    super__Vector_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::extent<char>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::extent<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage =
         (pointer)pstore::
                  diff<pstore::index::hamt_map<std::__cxx11::string,pstore::extent<char>,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>>,std::back_insert_iterator<std::vector<pstore::address,std::allocator<pstore::address>>>>
                            (&(this->super_Diff).db_,peVar3,0,bVar4);
    pdVar5 = (database *)
             std::
             __shared_ptr_access<pstore::index::hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::extent<char>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator*((__shared_ptr_access<pstore::index::hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::extent<char>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)&gtest_ar.message_);
    iVar6 = std::begin<std::vector<pstore::address,std::allocator<pstore::address>>>
                      ((vector<pstore::address,_std::allocator<pstore::address>_> *)local_258);
    gtest_ar_1.message_._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl =
         (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
          )std::end<std::vector<pstore::address,std::allocator<pstore::address>>>
                     ((vector<pstore::address,_std::allocator<pstore::address>_> *)local_258);
    (anonymous_namespace)::
    addresses_to_values<pstore::index::hamt_map<std::__cxx11::string,pstore::extent<char>,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>>,__gnu_cxx::__normal_iterator<pstore::address*,std::vector<pstore::address,std::allocator<pstore::address>>>>
              ((vector<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::extent<char>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::extent<char>_>_>_>
                *)local_280,(_anonymous_namespace_ *)&(this->super_Diff).db_,pdVar5,
               (hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::extent<char>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)iVar6._M_current,
               (__normal_iterator<pstore::address_*,_std::vector<pstore::address,_std::allocator<pstore::address>_>_>
                )gtest_ar_1.message_._M_t.
                 super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 .
                 super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                 ._M_head_impl,in_R9);
    testing::
    UnorderedElementsAre<std::pair<std::__cxx11::string,pstore::extent<char>>,std::pair<std::__cxx11::string,pstore::extent<char>>>
              (&local_360,(testing *)(k1.field_2._M_local_buf + 8),
               (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::extent<char>_>
                *)local_1c8,
               (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::extent<char>_>
                *)iVar6._M_current);
    testing::internal::
    MakePredicateFormatterFromMatcher<testing::internal::UnorderedElementsAreMatcher<std::tuple<std::pair<std::__cxx11::string,pstore::extent<char>>,std::pair<std::__cxx11::string,pstore::extent<char>>>>>
              (&local_300,(internal *)&local_360,matcher);
    testing::internal::
    PredicateFormatterFromMatcher<testing::internal::UnorderedElementsAreMatcher<std::tuple<std::pair<std::__cxx11::string,pstore::extent<char>>,std::pair<std::__cxx11::string,pstore::extent<char>>>>>
    ::operator()(local_2a0,(char *)&local_300,
                 (vector<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::extent<char>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::extent<char>_>_>_>
                  *)"actual_values");
    testing::internal::
    PredicateFormatterFromMatcher<testing::internal::UnorderedElementsAreMatcher<std::tuple<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::extent<char>_>,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::extent<char>_>_>_>_>
    ::~PredicateFormatterFromMatcher(&local_300);
    testing::internal::
    UnorderedElementsAreMatcher<std::tuple<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::extent<char>_>,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::extent<char>_>_>_>
    ::~UnorderedElementsAreMatcher(&local_360);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_2a0);
    if (!bVar1) {
      testing::Message::Message(&local_368);
      pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_2a0);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)
                 &index_1.
                  super___shared_ptr<pstore::index::hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::extent<char>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_(__gnu_cxx::_Lock_policy)2>
                  ._M_refcount,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/core/test_diff.cpp"
                 ,0xab,pcVar2);
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)
                 &index_1.
                  super___shared_ptr<pstore::index::hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::extent<char>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_(__gnu_cxx::_Lock_policy)2>
                  ._M_refcount,&local_368);
      testing::internal::AssertHelper::~AssertHelper
                ((AssertHelper *)
                 &index_1.
                  super___shared_ptr<pstore::index::hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::extent<char>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_(__gnu_cxx::_Lock_policy)2>
                  ._M_refcount);
      testing::Message::~Message(&local_368);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_2a0);
    std::
    vector<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::extent<char>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::extent<char>_>_>_>
    ::~vector((vector<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::extent<char>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::extent<char>_>_>_>
               *)local_280);
    std::vector<pstore::address,_std::allocator<pstore::address>_>::~vector
              ((vector<pstore::address,_std::allocator<pstore::address>_> *)local_258);
    actual.super__Vector_base<pstore::address,_std::allocator<pstore::address>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._4_4_ = 0;
  }
  std::
  shared_ptr<pstore::index::hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::extent<char>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~shared_ptr((shared_ptr<pstore::index::hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::extent<char>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 *)&gtest_ar.message_);
  if (actual.super__Vector_base<pstore::address,_std::allocator<pstore::address>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage._4_4_ == 0) {
    pstore::index::
    get_index<(pstore::trailer::indices)5,pstore::database,pstore::index::hamt_map<std::__cxx11::string,pstore::extent<char>,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>>>
              ((index *)&gtest_ar_2.message_,&(this->super_Diff).db_,true);
    local_398 = (void *)0x0;
    testing::internal::
    CmpHelperNE<std::shared_ptr<pstore::index::hamt_map<std::__cxx11::string,pstore::extent<char>,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>>>,decltype(nullptr)>
              ((internal *)local_390,"index","nullptr",
               (shared_ptr<pstore::index::hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::extent<char>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                *)&gtest_ar_2.message_,&local_398);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_390);
    if (!bVar1) {
      testing::Message::Message(&local_3a0);
      pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_390);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)
                 &actual_1.super__Vector_base<pstore::address,_std::allocator<pstore::address>_>.
                  _M_impl.super__Vector_impl_data._M_end_of_storage,kFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/core/test_diff.cpp"
                 ,0xb1,pcVar2);
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)
                 &actual_1.super__Vector_base<pstore::address,_std::allocator<pstore::address>_>.
                  _M_impl.super__Vector_impl_data._M_end_of_storage,&local_3a0);
      testing::internal::AssertHelper::~AssertHelper
                ((AssertHelper *)
                 &actual_1.super__Vector_base<pstore::address,_std::allocator<pstore::address>_>.
                  _M_impl.super__Vector_impl_data._M_end_of_storage);
      testing::Message::~Message(&local_3a0);
    }
    actual.super__Vector_base<pstore::address,_std::allocator<pstore::address>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._5_3_ = 0;
    actual.super__Vector_base<pstore::address,_std::allocator<pstore::address>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._4_1_ = !bVar1;
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_390);
    if (actual.super__Vector_base<pstore::address,_std::allocator<pstore::address>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage._4_4_ == 0) {
      std::vector<pstore::address,_std::allocator<pstore::address>_>::vector
                ((vector<pstore::address,_std::allocator<pstore::address>_> *)local_3c0);
      peVar3 = std::
               __shared_ptr_access<pstore::index::hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::extent<char>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator*((__shared_ptr_access<pstore::index::hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::extent<char>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)&gtest_ar_2.message_);
      bVar4 = std::back_inserter<std::vector<pstore::address,std::allocator<pstore::address>>>
                        ((vector<pstore::address,_std::allocator<pstore::address>_> *)local_3c0);
      actual_values_1.
      super__Vector_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::extent<char>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::extent<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage =
           (pointer)pstore::
                    diff<pstore::index::hamt_map<std::__cxx11::string,pstore::extent<char>,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>>,std::back_insert_iterator<std::vector<pstore::address,std::allocator<pstore::address>>>>
                              (&(this->super_Diff).db_,peVar3,1,bVar4);
      pdVar5 = (database *)
               std::
               __shared_ptr_access<pstore::index::hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::extent<char>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator*((__shared_ptr_access<pstore::index::hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::extent<char>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)&gtest_ar_2.message_);
      iVar6 = std::begin<std::vector<pstore::address,std::allocator<pstore::address>>>
                        ((vector<pstore::address,_std::allocator<pstore::address>_> *)local_3c0);
      gtest_ar_3.message_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl =
           (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
            )std::end<std::vector<pstore::address,std::allocator<pstore::address>>>
                       ((vector<pstore::address,_std::allocator<pstore::address>_> *)local_3c0);
      (anonymous_namespace)::
      addresses_to_values<pstore::index::hamt_map<std::__cxx11::string,pstore::extent<char>,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>>,__gnu_cxx::__normal_iterator<pstore::address*,std::vector<pstore::address,std::allocator<pstore::address>>>>
                ((vector<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::extent<char>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::extent<char>_>_>_>
                  *)local_3e8,(_anonymous_namespace_ *)&(this->super_Diff).db_,pdVar5,
                 (hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::extent<char>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)iVar6._M_current,
                 (__normal_iterator<pstore::address_*,_std::vector<pstore::address,_std::allocator<pstore::address>_>_>
                  )gtest_ar_3.message_._M_t.
                   super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   .
                   super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                   ._M_head_impl,in_R9);
      testing::UnorderedElementsAre<std::pair<std::__cxx11::string,pstore::extent<char>>>
                (&local_468,(testing *)local_1c8,matchers);
      testing::internal::
      MakePredicateFormatterFromMatcher<testing::internal::UnorderedElementsAreMatcher<std::tuple<std::pair<std::__cxx11::string,pstore::extent<char>>>>>
                (&local_438,(internal *)&local_468,matcher_00);
      testing::internal::
      PredicateFormatterFromMatcher<testing::internal::UnorderedElementsAreMatcher<std::tuple<std::pair<std::__cxx11::string,pstore::extent<char>>>>>
      ::operator()(local_408,(char *)&local_438,
                   (vector<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::extent<char>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::extent<char>_>_>_>
                    *)"actual_values");
      testing::internal::
      PredicateFormatterFromMatcher<testing::internal::UnorderedElementsAreMatcher<std::tuple<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::extent<char>_>_>_>_>
      ::~PredicateFormatterFromMatcher(&local_438);
      testing::internal::
      UnorderedElementsAreMatcher<std::tuple<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::extent<char>_>_>_>
      ::~UnorderedElementsAreMatcher(&local_468);
      bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_408);
      if (!bVar1) {
        testing::Message::Message(&local_470);
        pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_408);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&gtest_ar_4.message_,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/core/test_diff.cpp"
                   ,0xb7,pcVar2);
        testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_4.message_,&local_470);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_4.message_);
        testing::Message::~Message(&local_470);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_408);
      std::
      vector<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::extent<char>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::extent<char>_>_>_>
      ::~vector((vector<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::extent<char>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::extent<char>_>_>_>
                 *)local_3e8);
      std::vector<pstore::address,_std::allocator<pstore::address>_>::~vector
                ((vector<pstore::address,_std::allocator<pstore::address>_> *)local_3c0);
      actual.super__Vector_base<pstore::address,_std::allocator<pstore::address>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage._4_4_ = 0;
    }
    std::
    shared_ptr<pstore::index::hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::extent<char>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::~shared_ptr((shared_ptr<pstore::index::hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::extent<char>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   *)&gtest_ar_2.message_);
    if (actual.super__Vector_base<pstore::address,_std::allocator<pstore::address>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage._4_4_ == 0) {
      local_48c = pstore::database::get_current_revision(&(this->super_Diff).db_);
      local_490 = 1;
      testing::internal::EqHelper::Compare<unsigned_int,_unsigned_int,_nullptr>
                ((EqHelper *)local_488,"db_.get_current_revision ()","1U",&local_48c,&local_490);
      bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_488);
      if (!bVar1) {
        testing::Message::Message(&local_498);
        pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_488);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)
                   &actual_2.super__Vector_base<pstore::address,_std::allocator<pstore::address>_>.
                    _M_impl.super__Vector_impl_data._M_end_of_storage,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/core/test_diff.cpp"
                   ,0xbc,pcVar2);
        testing::internal::AssertHelper::operator=
                  ((AssertHelper *)
                   &actual_2.super__Vector_base<pstore::address,_std::allocator<pstore::address>_>.
                    _M_impl.super__Vector_impl_data._M_end_of_storage,&local_498);
        testing::internal::AssertHelper::~AssertHelper
                  ((AssertHelper *)
                   &actual_2.super__Vector_base<pstore::address,_std::allocator<pstore::address>_>.
                    _M_impl.super__Vector_impl_data._M_end_of_storage);
        testing::Message::~Message(&local_498);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_488);
      std::vector<pstore::address,_std::allocator<pstore::address>_>::vector
                ((vector<pstore::address,_std::allocator<pstore::address>_> *)local_4b8);
      pdVar5 = &(this->super_Diff).db_;
      pstore::index::
      get_index<(pstore::trailer::indices)5,pstore::database,pstore::index::hamt_map<std::__cxx11::string,pstore::extent<char>,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>>>
                ((index *)&local_4c8,pdVar5,true);
      peVar3 = std::
               __shared_ptr_access<pstore::index::hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::extent<char>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator*((__shared_ptr_access<pstore::index::hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::extent<char>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)&local_4c8);
      bVar4 = std::back_inserter<std::vector<pstore::address,std::allocator<pstore::address>>>
                        ((vector<pstore::address,_std::allocator<pstore::address>_> *)local_4b8);
      gtest_ar_5.message_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl =
           (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
            )pstore::
             diff<pstore::index::hamt_map<std::__cxx11::string,pstore::extent<char>,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>>,std::back_insert_iterator<std::vector<pstore::address,std::allocator<pstore::address>>>>
                       (pdVar5,peVar3,2,bVar4);
      std::
      shared_ptr<pstore::index::hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::extent<char>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::~shared_ptr(&local_4c8);
      local_4f0 = std::vector<pstore::address,_std::allocator<pstore::address>_>::size
                            ((vector<pstore::address,_std::allocator<pstore::address>_> *)local_4b8)
      ;
      local_4f4 = 0;
      testing::internal::EqHelper::Compare<unsigned_long,_unsigned_int,_nullptr>
                ((EqHelper *)local_4e8,"actual.size ()","0U",&local_4f0,&local_4f4);
      bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_4e8);
      if (!bVar1) {
        testing::Message::Message(&local_500);
        pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_4e8);
        testing::internal::AssertHelper::AssertHelper
                  (&local_508,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/core/test_diff.cpp"
                   ,0xc0,pcVar2);
        testing::internal::AssertHelper::operator=(&local_508,&local_500);
        testing::internal::AssertHelper::~AssertHelper(&local_508);
        testing::Message::~Message(&local_500);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_4e8);
      std::vector<pstore::address,_std::allocator<pstore::address>_>::~vector
                ((vector<pstore::address,_std::allocator<pstore::address>_> *)local_4b8);
      pstore::transaction_base::commit((transaction_base *)local_188);
      actual.super__Vector_base<pstore::address,_std::allocator<pstore::address>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage._4_4_ = 0;
    }
  }
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::extent<char>_>
  ::~pair((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::extent<char>_>
           *)local_1c8);
  pstore::transaction<std::unique_lock<mock_mutex>_>::~transaction
            ((transaction<std::unique_lock<mock_mutex>_> *)local_188);
  std::__cxx11::string::~string((string *)local_148);
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::extent<char>_>
  ::~pair((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::extent<char>_>
           *)((long)&k1.field_2 + 8));
  return;
}

Assistant:

TEST_F (Diff, UncomittedTransaction) {
    using ::testing::UnorderedElementsAre;

    using value_type = std::pair<std::string, pstore::extent<char>>;
    value_type v1;

    {
        std::string const k1 = "key1";
        transaction_type t1 = begin (db_, lock_guard{mutex_});
        v1 = std::make_pair (k1, this->add (t1, k1, "first value"));
        t1.commit ();
    }

    // The transaction t2 is left uncommitted whilst we perform the diff.
    std::string const k2 = "key2";
    transaction_type t2 = begin (db_, lock_guard{mutex_});
    value_type v2 = std::make_pair (k2, this->add (t2, k2, "second value"));

    {
        // Check the diff between now (the uncommitted r2) and r0.
        auto index = pstore::index::get_index<pstore::trailer::indices::write> (db_);
        ASSERT_NE (index, nullptr);

        std::vector<pstore::address> actual;
        pstore::diff (db_, *index, 0U, std::back_inserter (actual));
        auto const actual_values =
            addresses_to_values (db_, *index, std::begin (actual), std::end (actual));
        EXPECT_THAT (actual_values, UnorderedElementsAre (v1, v2));
    }

    {
        // Check the diff between now and r1.
        auto index = pstore::index::get_index<pstore::trailer::indices::write> (db_);
        ASSERT_NE (index, nullptr);

        std::vector<pstore::address> actual;
        pstore::diff (db_, *index, 1U, std::back_inserter (actual));
        auto const actual_values =
            addresses_to_values (db_, *index, std::begin (actual), std::end (actual));
        EXPECT_THAT (actual_values, UnorderedElementsAre (v2));
    }

    {
        // Note that get_current_revision() still reports 1 even though a transaction is open.
        EXPECT_EQ (db_.get_current_revision (), 1U);
        std::vector<pstore::address> actual;
        pstore::diff (db_, *pstore::index::get_index<pstore::trailer::indices::write> (db_), 2U,
                      std::back_inserter (actual));
        EXPECT_EQ (actual.size (), 0U);
    }

    t2.commit ();
}